

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O1

int wally_wif_from_bytes
              (uchar *priv_key,size_t priv_key_len,uint32_t prefix,uint32_t flags,char **output)

{
  int iVar1;
  size_t bytes_len;
  uchar buf [34];
  uchar local_38;
  undefined8 local_37;
  undefined8 uStack_2f;
  undefined8 local_27;
  undefined8 uStack_1f;
  undefined1 local_17;
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  iVar1 = -2;
  if ((((priv_key != (uchar *)0x0) && (priv_key_len == 0x20)) && (prefix < 0x100)) &&
     ((flags < 2 && (output != (char **)0x0)))) {
    local_38 = (uchar)prefix;
    local_37 = *(undefined8 *)priv_key;
    uStack_2f = *(undefined8 *)(priv_key + 8);
    local_27 = *(undefined8 *)(priv_key + 0x10);
    uStack_1f = *(undefined8 *)(priv_key + 0x18);
    bytes_len = 0x21;
    if (flags == 0) {
      local_17 = 1;
      bytes_len = 0x22;
    }
    iVar1 = wally_base58_from_bytes(&local_38,bytes_len,1,output);
    wally_clear(&local_38,0x22);
  }
  return iVar1;
}

Assistant:

int wally_wif_from_bytes(const unsigned char *priv_key,
                         size_t priv_key_len,
                         uint32_t prefix,
                         uint32_t flags,
                         char **output)
{
    int ret;
    unsigned char buf[2 + EC_PRIVATE_KEY_LEN];
    size_t buf_len = sizeof(buf);

    if (output)
        *output = NULL;

    if(!priv_key || priv_key_len != EC_PRIVATE_KEY_LEN || (prefix & ~0xff) ||
       (flags & ~WIF_ALL_DEFINED_FLAGS) || !output)
        return WALLY_EINVAL;

    buf[0] = (unsigned char) prefix & 0xff;
    memcpy(&buf[1], priv_key, EC_PRIVATE_KEY_LEN);

    if (flags & WALLY_WIF_FLAG_UNCOMPRESSED)
        buf_len--;
    else
        buf[buf_len - 1] = 0x01;

    ret = wally_base58_from_bytes(buf, buf_len, BASE58_FLAG_CHECKSUM, output);

    wally_clear(buf, sizeof(buf));
    return ret;
}